

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortA.c
# Opt level: O3

int bursttraverseA(TRIE_conflict *node,string *strings,int pos,unsigned_short deep)

{
  uchar **a;
  char **ppcVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int depth;
  int iVar5;
  undefined6 in_register_0000000a;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  char **__ptr;
  long lVar10;
  uint uVar11;
  bool bVar12;
  
  uVar7 = (ulong)(uint)pos;
  depth = (int)CONCAT62(in_register_0000000a,deep) + 1;
  lVar10 = 0;
  do {
    uVar2 = node->counts[lVar10];
    if ((ulong)uVar2 != 0) {
      if (uVar2 == 0xffffffff) {
        uVar2 = bursttraverseA((TRIE_conflict *)node->ptrs[lVar10],strings,(int)uVar7,
                               (unsigned_short)depth);
        uVar7 = (ulong)uVar2;
      }
      else if (lVar10 == 0) {
        iVar5 = -((int)uVar2 >> 0x1f);
        iVar3 = (int)uVar2 / 0x1fff + ((int)uVar2 >> 0x1f);
        uVar8 = iVar3 + iVar5 + 1U & 0xffff;
        if (uVar8 != 0) {
          __ptr = node->ptrs[0];
          uVar11 = 1;
          do {
            uVar4 = 0x1fff;
            if (uVar11 == uVar8) {
              uVar4 = uVar2 + (iVar3 + iVar5) * -0x1fff & 0xffff;
            }
            if (uVar4 == 0) {
              uVar9 = 0;
            }
            else {
              uVar9 = (ulong)uVar4;
              uVar6 = 0;
              do {
                strings[(long)(int)uVar7 + uVar6] = (string)__ptr[uVar6];
                uVar6 = uVar6 + 1;
              } while (uVar9 != uVar6);
              uVar7 = (ulong)(uint)((int)uVar7 + (int)uVar6);
            }
            ppcVar1 = (char **)__ptr[uVar9];
            free(__ptr);
            bVar12 = uVar11 != uVar8;
            __ptr = ppcVar1;
            uVar11 = uVar11 + 1;
          } while (bVar12);
        }
      }
      else if ((int)uVar2 < 1) {
        free(node->ptrs[lVar10]);
      }
      else {
        a = strings + (int)uVar7;
        uVar9 = 0;
        do {
          a[uVar9] = (uchar *)node->ptrs[lVar10][uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
        uVar7 = (uVar7 & 0xffffffff) + uVar9;
        free(node->ptrs[lVar10]);
        if (uVar2 != 1) {
          if (uVar2 < 0x14) {
            inssort(a,(int)uVar9,depth);
          }
          else {
            mkqsort(a,(int)uVar9,depth);
          }
        }
      }
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x100);
  free(node);
  return (int)uVar7;
}

Assistant:

static int
bursttraverseA(TRIE *node, string strings[], int pos, unsigned short deep)
{
    int i, j, k; 
    int off = 0;
    unsigned short no_of_buckets=0, no_elements_in_last_bucket=0, no_elements_in_bucket=0; 
    char **nullbucket, **headbucket;
    int count;

    for( i=0 ; i < ALPHABET; i++)
    {
        count = node->counts[i];

        if( !++count )
        {
            pos = bursttraverseA((TRIE *) node->ptrs[i], strings, pos, deep+1);
        }
        else if (--count)
        {
            if(i==0)
            {
                no_of_buckets = (count/THRESHOLDMINUSONE) + 1;
                no_elements_in_last_bucket = count % THRESHOLDMINUSONE;
                nullbucket = node->ptrs[i];
                headbucket = node->ptrs[i];
                off=pos;

                /* traverse all arrays in the bucket */
                for (k=1; k <= no_of_buckets; k++)
                {
                    if(k==no_of_buckets)
                        no_elements_in_bucket = no_elements_in_last_bucket;
                    else
                        no_elements_in_bucket = THRESHOLDMINUSONE;

                    /* traverse all elements in each bucket */
                    for (j=0; j < no_elements_in_bucket ; j++, off++) 
                    {
			strings[off] = (unsigned char*) nullbucket[j];
                    }
                    nullbucket = (char **) nullbucket[j];
                    free(headbucket);
                    headbucket = nullbucket;
                }
            }
            else
            {
                for( j=0, off=pos ; j < count ; j++, off++)
                    strings[off] = (unsigned char*) node->ptrs[i][j];

                free( node->ptrs[i] );

                if (count > 1)
                {
                    if (count < INSERTBREAK)
                        inssort( strings+pos, off-pos, deep + 1);  
                    else
                        mkqsort( strings+pos, off-pos, deep + 1);
                }
            }
            pos = off;
        }
    }
    free(node);
    return pos; 
}